

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTools.hpp
# Opt level: O0

int64_t CLI::detail::to_flag_value(string *val)

{
  char cVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  char *local_70;
  char *loc_ptr;
  int64_t ret;
  string local_40;
  allocator local_1a;
  allocator local_19;
  string *local_18;
  string *val_local;
  
  local_18 = val;
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar4 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true",
               &local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar4 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false",
               &local_1a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  _Var2 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  if (_Var2) {
    return 1;
  }
  _Var2 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  if (_Var2) {
    return -1;
  }
  ::std::__cxx11::string::string((string *)&ret,(string *)val);
  to_lower(&local_40,(string *)&ret);
  ::std::__cxx11::string::operator=((string *)val,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&ret);
  loc_ptr = (char *)0x0;
  lVar5 = ::std::__cxx11::string::size();
  if (lVar5 == 1) {
    pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)val);
    if (('0' < *pcVar6) &&
       (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)val), *pcVar6 < ':')) {
      pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)val);
      return (long)*pcVar6 + -0x30;
    }
    pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)val);
    cVar1 = *pcVar6;
    if (cVar1 != '+') {
      if ((((cVar1 == '-') || (cVar1 == '0')) || (cVar1 == 'f')) || (cVar1 == 'n')) {
        return -1;
      }
      if ((cVar1 != 't') && (cVar1 != 'y')) {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        return -1;
      }
    }
    return 1;
  }
  _Var2 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  if ((((_Var2) || (bVar3 = ::std::operator==(val,"on"), bVar3)) ||
      (bVar3 = ::std::operator==(val,"yes"), bVar3)) ||
     (bVar3 = ::std::operator==(val,"enable"), bVar3)) {
    loc_ptr = (char *)0x1;
  }
  else {
    _Var2 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
    if (((_Var2) || (bVar3 = ::std::operator==(val,"off"), bVar3)) ||
       ((bVar3 = ::std::operator==(val,"no"), bVar3 ||
        (bVar3 = ::std::operator==(val,"disable"), bVar3)))) {
      loc_ptr = (char *)0xffffffffffffffff;
    }
    else {
      local_70 = (char *)0x0;
      pcVar6 = (char *)::std::__cxx11::string::c_str();
      loc_ptr = (char *)strtoll(pcVar6,&local_70,0);
      pcVar6 = local_70;
      lVar5 = ::std::__cxx11::string::c_str();
      lVar8 = ::std::__cxx11::string::size();
      if ((pcVar6 != (char *)(lVar5 + lVar8)) && (piVar7 = __errno_location(), *piVar7 == 0)) {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
      }
    }
  }
  return (int64_t)loc_ptr;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) noexcept {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret = 0;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            errno = EINVAL;
            return -1;
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        char *loc_ptr{nullptr};
        ret = std::strtoll(val.c_str(), &loc_ptr, 0);
        if(loc_ptr != (val.c_str() + val.size()) && errno == 0) {
            errno = EINVAL;
        }
    }
    return ret;
}